

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  ulong uVar1;
  undefined4 uVar2;
  long lVar3;
  const_pointer pcVar4;
  long *plVar5;
  long *plVar6;
  StringPiece *in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db_01;
  StringPiece SVar9;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  uVar1 = in_RSI->size_;
  if (uVar1 < 100) {
    pcVar4 = in_RSI->data_;
    *(re2 **)this = this + 0x10;
    if (pcVar4 == (const_pointer)0x0) {
      *(undefined8 *)(this + 8) = 0;
      this[0x10] = (re2)0x0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar4,pcVar4 + uVar1);
      __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
  }
  else {
    SVar9 = StringPiece::substr(in_RSI,0,100);
    pcVar4 = SVar9.data_;
    if (pcVar4 == (const_pointer)0x0) {
      local_28 = local_18;
      local_20 = 0;
      local_18[0] = 0;
    }
    else {
      local_28 = local_18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_28,pcVar4,pcVar4 + SVar9.size_);
    }
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_28);
    *(re2 **)this = this + 0x10;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      uVar7 = (undefined4)*plVar6;
      uVar8 = *(undefined4 *)((long)plVar5 + 0x14);
      lVar3 = plVar5[3];
      uVar2 = *(undefined4 *)((long)plVar5 + 0x1c);
      *(undefined4 *)(this + 0x10) = uVar7;
      *(undefined4 *)(this + 0x14) = uVar8;
      *(int *)(this + 0x18) = (int)lVar3;
      *(undefined4 *)(this + 0x1c) = uVar2;
    }
    else {
      *(long **)this = (long *)*plVar5;
      *(long *)(this + 0x10) = *plVar6;
      uVar7 = extraout_XMM0_Da_00;
      uVar8 = extraout_XMM0_Db_00;
    }
    __x = (double)CONCAT44(uVar8,uVar7);
    *(long *)(this + 8) = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_28 != local_18) {
      operator_delete(local_28);
      __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
  }
  return __x;
}

Assistant:

static std::string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return std::string(pattern);
  return std::string(pattern.substr(0, 100)) + "...";
}